

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsthandl.c
# Opt level: O0

LispPTR N_OP_fmemb(LispPTR item,LispPTR tos)

{
  LispPTR LVar1;
  uint local_14;
  LispPTR tos_local;
  LispPTR item_local;
  
  local_14 = tos;
  while( true ) {
    if ((*(ushort *)((ulong)(MDStypetbl + (local_14 >> 9)) ^ 2) & 0x7ff) != 5) {
      if (local_14 != 0) {
        MachineState.tosvalue = local_14;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      return 0;
    }
    LVar1 = car(local_14);
    if (item == LVar1) break;
    local_14 = cdr(local_14);
    if (MachineState.irqend == 0) {
      MachineState.errorexit = 1;
      MachineState.tosvalue = local_14;
      return 0xfffffffe;
    }
  }
  return local_14;
}

Assistant:

LispPTR N_OP_fmemb(LispPTR item, LispPTR tos) { /* OP 34Q */

  while (Listp(tos)) {
    if (item == car(tos)) return tos;
    tos = cdr(tos);
    /* if we get an interrupt, punt so we can handle it safely */
    if (!Irq_Stk_End) { TIMER_EXIT(tos); }
  }
  if (tos) ERROR_EXIT(tos);
  return tos;

}